

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,Operator op)

{
  undefined4 s_00;
  undefined4 s_01;
  undefined4 out1;
  undefined4 out;
  undefined4 out1_00;
  undefined4 out1_01;
  undefined4 o;
  undefined4 l;
  undefined4 l2;
  undefined4 l1;
  undefined4 l1_00;
  undefined4 l_00;
  SizeType SVar1;
  SizeType o_00;
  SizeType SVar2;
  size_t sVar3;
  Frag *pFVar4;
  Frag local_c4;
  SizeType local_b8;
  SizeType SStack_b4;
  SizeType s_3;
  Frag e_2;
  SizeType local_a0;
  SizeType SStack_98;
  SizeType s_2;
  Frag e_1;
  SizeType local_84;
  SizeType SStack_7c;
  SizeType s_1;
  Frag e;
  SizeType local_68;
  SizeType SStack_60;
  SizeType s;
  Frag e1_1;
  Frag e2_1;
  SizeType local_40;
  SizeType local_3c;
  SizeType SStack_38;
  Frag e1;
  Frag e2;
  Operator op_local;
  Stack<rapidjson::CrtAllocator> *operandStack_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  switch(op) {
  case kZeroOrOne:
    sVar3 = Stack<rapidjson::CrtAllocator>::GetSize(operandStack);
    if (sVar3 < 0xc) {
      this_local._7_1_ = false;
    }
    else {
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      out1_00 = pFVar4->start;
      l1_00 = pFVar4->out;
      e.start = pFVar4->minIndex;
      SVar2 = NewState(this,0xffffffff,out1_00,0);
      SVar1 = Append(this,l1_00,SVar2);
      Frag::Frag((Frag *)&e_1.out,SVar2,SVar1,e.start);
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      pFVar4->start = e_1.out;
      pFVar4->out = e_1.minIndex;
      pFVar4->minIndex = local_84;
      this_local._7_1_ = true;
    }
    break;
  case kZeroOrMore:
    sVar3 = Stack<rapidjson::CrtAllocator>::GetSize(operandStack);
    if (sVar3 < 0xc) {
      this_local._7_1_ = false;
    }
    else {
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      out1_01 = pFVar4->start;
      l_00 = pFVar4->out;
      e_1.start = pFVar4->minIndex;
      SVar2 = NewState(this,0xffffffff,out1_01,0);
      Patch(this,l_00,SVar2);
      Frag::Frag((Frag *)&e_2.out,SVar2,SVar2,e_1.start);
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      pFVar4->start = e_2.out;
      pFVar4->out = e_2.minIndex;
      pFVar4->minIndex = local_a0;
      this_local._7_1_ = true;
    }
    break;
  case kOneOrMore:
    sVar3 = Stack<rapidjson::CrtAllocator>::GetSize(operandStack);
    if (sVar3 < 0xc) {
      this_local._7_1_ = false;
    }
    else {
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      SStack_b4 = pFVar4->start;
      s_3 = pFVar4->out;
      e_2.start = pFVar4->minIndex;
      local_b8 = NewState(this,0xffffffff,SStack_b4,0);
      Patch(this,s_3,local_b8);
      Frag::Frag(&local_c4,SStack_b4,local_b8,e_2.start);
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      pFVar4->start = local_c4.start;
      pFVar4->out = local_c4.out;
      pFVar4->minIndex = local_c4.minIndex;
      this_local._7_1_ = true;
    }
    break;
  case kConcatenation:
    sVar3 = Stack<rapidjson::CrtAllocator>::GetSize(operandStack);
    if (sVar3 < 0x18) {
      __assert_fail("operandStack.GetSize() >= sizeof(Frag) * 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                    ,0x165,
                    "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Eval(Stack<Allocator> &, Operator) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    s_00 = pFVar4->start;
    o = pFVar4->out;
    SVar2 = pFVar4->minIndex;
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    s_01 = pFVar4->start;
    l = pFVar4->out;
    SVar1 = pFVar4->minIndex;
    Patch(this,l,s_00);
    SVar2 = Min(SVar1,SVar2);
    Frag::Frag((Frag *)&e2_1.out,s_01,o,SVar2);
    pFVar4 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    pFVar4->start = e2_1.out;
    pFVar4->out = e2_1.minIndex;
    pFVar4->minIndex = local_40;
    this_local._7_1_ = true;
    break;
  case kAlternation:
    sVar3 = Stack<rapidjson::CrtAllocator>::GetSize(operandStack);
    if (sVar3 < 0x18) {
      this_local._7_1_ = false;
    }
    else {
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      out1 = pFVar4->start;
      l2 = pFVar4->out;
      e2_1.start = pFVar4->minIndex;
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      out = pFVar4->start;
      l1 = pFVar4->out;
      SVar2 = pFVar4->minIndex;
      SVar1 = NewState(this,out,out1,0);
      o_00 = Append(this,l1,l2);
      SVar2 = Min(SVar2,e2_1.start);
      Frag::Frag((Frag *)&e.out,SVar1,o_00,SVar2);
      pFVar4 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         (operandStack,1);
      pFVar4->start = e.out;
      pFVar4->out = e.minIndex;
      pFVar4->minIndex = local_68;
      this_local._7_1_ = true;
    }
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Eval(Stack<Allocator>& operandStack, Operator op) {
        switch (op) {
            case kConcatenation:
                RAPIDJSON_ASSERT(operandStack.GetSize() >= sizeof(Frag) * 2);
                {
                    Frag e2 = *operandStack.template Pop<Frag>(1);
                    Frag e1 = *operandStack.template Pop<Frag>(1);
                    Patch(e1.out, e2.start);
                    *operandStack.template Push<Frag>() = Frag(e1.start, e2.out, Min(e1.minIndex, e2.minIndex));
                }
                return true;

            case kAlternation:
                if (operandStack.GetSize() >= sizeof(Frag) * 2) {
                    Frag e2 = *operandStack.template Pop<Frag>(1);
                    Frag e1 = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(e1.start, e2.start, 0);
                    *operandStack.template Push<Frag>() = Frag(s, Append(e1.out, e2.out), Min(e1.minIndex, e2.minIndex));
                    return true;
                }
                return false;

            case kZeroOrOne:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    *operandStack.template Push<Frag>() = Frag(s, Append(e.out, s), e.minIndex);
                    return true;
                }
                return false;

            case kZeroOrMore:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    Patch(e.out, s);
                    *operandStack.template Push<Frag>() = Frag(s, s, e.minIndex);
                    return true;
                }
                return false;

            case kOneOrMore:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    Patch(e.out, s);
                    *operandStack.template Push<Frag>() = Frag(e.start, s, e.minIndex);
                    return true;
                }
                return false;

            default: 
                // syntax error (e.g. unclosed kLeftParenthesis)
                return false;
        }
    }